

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

Result __thiscall
presolve::HPresolve::presolveColSingletons(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  int iVar1;
  pointer piVar2;
  pointer puVar3;
  Result RVar4;
  int *piVar5;
  int *piVar6;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  
  piVar5 = (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar7 = (long)piVar6 - (long)piVar5;
  if (uVar7 != 0) {
    lVar9 = 0;
    do {
      if ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[piVar5[lVar9]] == '\0') {
        RVar4 = colPresolve(this,postsolve_stack,piVar5[lVar9]);
        if (RVar4 != kOk) {
          return RVar4;
        }
        piVar5 = (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      lVar9 = lVar9 + 1;
      uVar7 = (long)piVar6 - (long)piVar5;
    } while (lVar9 != (long)uVar7 >> 2);
  }
  piVar2 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (long)uVar7 >> 4) {
    piVar8 = (int *)((uVar7 & 0xfffffffffffffff0) + (long)piVar5);
    lVar9 = ((long)uVar7 >> 4) + 1;
    piVar5 = piVar5 + 2;
    do {
      if ((puVar3[piVar5[-2]] != '\0') || (1 < piVar2[piVar5[-2]])) {
        piVar5 = piVar5 + -2;
        goto LAB_00312715;
      }
      if ((puVar3[piVar5[-1]] != '\0') || (1 < piVar2[piVar5[-1]])) {
        piVar5 = piVar5 + -1;
        goto LAB_00312715;
      }
      if ((puVar3[*piVar5] != '\0') || (1 < piVar2[*piVar5])) goto LAB_00312715;
      if ((puVar3[piVar5[1]] != '\0') || (1 < piVar2[piVar5[1]])) {
        piVar5 = piVar5 + 1;
        goto LAB_00312715;
      }
      lVar9 = lVar9 + -1;
      piVar5 = piVar5 + 4;
    } while (1 < lVar9);
    uVar7 = (long)piVar6 - (long)piVar8;
    piVar5 = piVar8;
  }
  lVar9 = (long)uVar7 >> 2;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      if (lVar9 != 3) {
        return kOk;
      }
      if ((puVar3[*piVar5] != '\0') || (1 < piVar2[*piVar5])) goto LAB_00312715;
      piVar5 = piVar5 + 1;
    }
    if ((puVar3[*piVar5] != '\0') || (1 < piVar2[*piVar5])) goto LAB_00312715;
    piVar5 = piVar5 + 1;
  }
  if ((puVar3[*piVar5] == '\0') && (piVar2[*piVar5] < 2)) {
    piVar5 = piVar6;
  }
LAB_00312715:
  piVar8 = piVar5 + 1;
  if (piVar8 != piVar6 && piVar5 != piVar6) {
    do {
      iVar1 = *piVar8;
      if ((puVar3[iVar1] == '\0') && (piVar2[iVar1] < 2)) {
        *piVar5 = iVar1;
        piVar5 = piVar5 + 1;
      }
      piVar8 = piVar8 + 1;
    } while (piVar8 != piVar6);
  }
  if (piVar5 != piVar6) {
    (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::presolveColSingletons(
    HighsPostsolveStack& postsolve_stack) {
  for (size_t i = 0; i != singletonColumns.size(); ++i) {
    HighsInt col = singletonColumns[i];
    if (colDeleted[col]) continue;
    HPRESOLVE_CHECKED_CALL(colPresolve(postsolve_stack, col));
  }
  singletonColumns.erase(
      std::remove_if(
          singletonColumns.begin(), singletonColumns.end(),
          [&](HighsInt col) { return colDeleted[col] || colsize[col] > 1; }),
      singletonColumns.end());

  return Result::kOk;
}